

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ini_file.cpp
# Opt level: O0

bool __thiscall csguide_webserver::INIFile::Save(INIFile *this,string *file_path)

{
  byte bVar1;
  bool bVar2;
  const_iterator os;
  reference section_00;
  string *in_RSI;
  __normal_iterator<const_csguide_webserver::INISection_*,_std::vector<csguide_webserver::INISection,_std::allocator<csguide_webserver::INISection>_>_>
  *in_RDI;
  INISection *section;
  const_iterator __end1;
  const_iterator __begin1;
  vector<csguide_webserver::INISection,_std::allocator<csguide_webserver::INISection>_> *__range1;
  ofstream ofs;
  ostream *in_stack_fffffffffffffd98;
  __normal_iterator<const_csguide_webserver::INISection_*,_std::vector<csguide_webserver::INISection,_std::allocator<csguide_webserver::INISection>_>_>
  local_238 [2];
  undefined4 local_228;
  undefined1 local_218 [535];
  byte local_1;
  
  std::ofstream::ofstream(local_218,in_RSI,_S_out);
  bVar1 = std::ofstream::is_open();
  if ((bVar1 & 1) == 0) {
    local_1 = 0;
  }
  else {
    local_238[0]._M_current =
         (INISection *)
         std::vector<csguide_webserver::INISection,_std::allocator<csguide_webserver::INISection>_>
         ::begin((vector<csguide_webserver::INISection,_std::allocator<csguide_webserver::INISection>_>
                  *)in_stack_fffffffffffffd98);
    os = std::vector<csguide_webserver::INISection,_std::allocator<csguide_webserver::INISection>_>
         ::end((vector<csguide_webserver::INISection,_std::allocator<csguide_webserver::INISection>_>
                *)in_stack_fffffffffffffd98);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (in_RDI,(__normal_iterator<const_csguide_webserver::INISection_*,_std::vector<csguide_webserver::INISection,_std::allocator<csguide_webserver::INISection>_>_>
                                 *)in_stack_fffffffffffffd98);
      if (!bVar2) break;
      section_00 = __gnu_cxx::
                   __normal_iterator<const_csguide_webserver::INISection_*,_std::vector<csguide_webserver::INISection,_std::allocator<csguide_webserver::INISection>_>_>
                   ::operator*(local_238);
      in_stack_fffffffffffffd98 = operator<<((ostream *)os._M_current,section_00);
      std::operator<<(in_stack_fffffffffffffd98,'\n');
      __gnu_cxx::
      __normal_iterator<const_csguide_webserver::INISection_*,_std::vector<csguide_webserver::INISection,_std::allocator<csguide_webserver::INISection>_>_>
      ::operator++(local_238);
    }
    local_1 = 1;
  }
  local_228 = 1;
  std::ofstream::~ofstream(local_218);
  return (bool)(local_1 & 1);
}

Assistant:

bool INIFile::Save(const std::string& file_path) const {
  std::ofstream ofs(file_path);
  if (!ofs.is_open()) {
    return false;
  }

  for (const auto& section : sections_) {
    ofs << section << '\n';
  }

  return true;
}